

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall
Model::AddReaction(Model *this,double rate_constant,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *reactants,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *products)

{
  pointer pbVar1;
  SpeciesTracker *this_00;
  pointer pbVar2;
  shared_ptr<SpeciesReaction> rxn;
  undefined1 local_81;
  SpeciesReaction *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  Ptr local_70;
  Ptr local_60;
  Ptr local_50;
  Model *local_40;
  double local_38;
  
  local_80 = (SpeciesReaction *)0x0;
  local_38 = rate_constant;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SpeciesReaction,std::allocator<SpeciesReaction>,double&,double&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
            (&local_78,&local_80,(allocator<SpeciesReaction> *)&local_81,&local_38,
             &this->cell_volume_,reactants,products);
  std::__shared_ptr<SpeciesReaction,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<SpeciesReaction,SpeciesReaction>
            ((__shared_ptr<SpeciesReaction,(__gnu_cxx::_Lock_policy)2> *)&local_80,local_80);
  this_00 = SpeciesTracker::Instance();
  pbVar2 = (reactants->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (reactants->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_40 = this;
  if (pbVar2 != pbVar1) {
    do {
      local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_80->super_Reaction;
      local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_78._M_pi;
      if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
        }
      }
      SpeciesTracker::Add(this_00,pbVar2,&local_50);
      if (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != pbVar1);
  }
  pbVar2 = (products->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (products->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar1) {
    do {
      local_60.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_80->super_Reaction;
      local_60.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_78._M_pi;
      if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
        }
      }
      SpeciesTracker::Add(this_00,pbVar2,&local_60);
      if (local_60.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != pbVar1);
  }
  local_70.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_80->super_Reaction;
  local_70.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_78._M_pi;
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
    }
  }
  Gillespie::LinkReaction(&local_40->gillespie_,&local_70);
  if (local_70.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
  }
  return;
}

Assistant:

void Model::AddReaction(double rate_constant,
                        const std::vector<std::string> &reactants,
                        const std::vector<std::string> &products) {
  auto rxn = std::make_shared<SpeciesReaction>(rate_constant, cell_volume_,
                                               reactants, products);
  auto &tracker = SpeciesTracker::Instance();
  for (const auto &reactant : reactants) {
    tracker.Add(reactant, rxn);
  }
  for (const auto &product : products) {
    tracker.Add(product, rxn);
  }
  gillespie_.LinkReaction(rxn);
}